

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindConcatFunctionInternal
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool is_operator)

{
  LogicalTypeId LVar1;
  pointer puVar2;
  ScalarFunction *pSVar3;
  bool bVar4;
  bool bVar5;
  pointer pEVar6;
  LogicalType *pLVar7;
  ConcatFunctionData *pCVar8;
  FunctionData this_00;
  BinderException *pBVar9;
  type pEVar10;
  ParameterNotResolvedException *pPVar11;
  reference this_01;
  pointer puVar12;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var13;
  size_type __n;
  undefined7 in_register_00000081;
  undefined4 uVar14;
  undefined4 uVar16;
  string type_list;
  LogicalType next_type;
  LogicalType child_type;
  string local_e8;
  undefined4 local_c4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_c0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_b8;
  ScalarFunction *local_b0;
  string local_a8;
  ClientContext *local_88;
  LogicalType local_80;
  LogicalType local_68;
  string local_50;
  ulong uVar15;
  
  uVar15 = CONCAT71(in_register_00000081,is_operator) & 0xffffffff;
  uVar14 = (undefined4)CONCAT71(in_register_00000081,is_operator);
  puVar12 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  uVar16 = uVar14;
  local_c0 = arguments;
  local_b8._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  local_b0 = bound_function;
  local_88 = context;
  if (puVar12 != puVar2) {
    bVar5 = false;
    do {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      if ((pEVar6->return_type).id_ == UNKNOWN) {
        pPVar11 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(pPVar11);
        __cxa_throw(pPVar11,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      if (((pEVar6->return_type).id_ == LIST) ||
         (pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(puVar12), (pEVar6->return_type).id_ == ARRAY)) {
        bVar5 = true;
      }
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      uVar15 = uVar15 & 0xff;
      if ((pEVar6->return_type).id_ != BLOB) {
        uVar15 = 0;
      }
      uVar16 = (undefined4)uVar15;
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
  }
  if (!bVar5) {
    LogicalType::LogicalType((LogicalType *)&local_e8,((byte)uVar16 & 1) + VARCHAR);
    pSVar3 = local_b0;
    SetArgumentType(local_b0,(LogicalType *)&local_e8,is_operator);
    LogicalType::~LogicalType((LogicalType *)&local_e8);
    pCVar8 = (ConcatFunctionData *)operator_new(0x28);
    ConcatFunctionData::ConcatFunctionData
              (pCVar8,&(pSVar3->super_BaseScalarFunction).return_type,is_operator);
    *(ConcatFunctionData **)
     local_b8._M_t.
     super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
     super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = pCVar8;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  local_c4 = uVar14;
  LogicalType::LogicalType(&local_68,SQLNULL);
  puVar12 = (local_c0->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_c0->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar2) {
    bVar5 = true;
    do {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar12);
      LogicalType::LogicalType((LogicalType *)&local_e8,SQLNULL);
      pLVar7 = &pEVar6->return_type;
      bVar4 = LogicalType::operator==(pLVar7,(LogicalType *)&local_e8);
      LogicalType::~LogicalType((LogicalType *)&local_e8);
      if (!bVar4) {
        LogicalType::LogicalType(&local_80,INVALID);
        LVar1 = pLVar7->id_;
        if (LVar1 == LIST) {
          pLVar7 = ListType::GetChildType(pLVar7);
        }
        else {
          if (LVar1 != ARRAY) {
            if (LVar1 != UNKNOWN) {
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              local_e8._M_string_length = 0;
              local_e8.field_2._M_local_buf[0] = '\0';
              if ((local_c0->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (local_c0->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                __n = 0;
                do {
                  if (local_e8._M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)&local_e8);
                  }
                  this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            ::operator[](local_c0,__n);
                  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->(this_01);
                  LogicalType::ToString_abi_cxx11_(&local_a8,&pEVar6->return_type);
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_e8,(ulong)local_a8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p);
                  }
                  __n = __n + 1;
                } while (__n < (ulong)((long)(local_c0->
                                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ).
                                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_c0->
                                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ).
                                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3));
              }
              pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
              pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator*(puVar12);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,
                         "Cannot concatenate types %s - an explicit cast is required","");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_e8._M_dataplus._M_p,
                         local_e8._M_dataplus._M_p + local_e8._M_string_length);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar9,pEVar10,(string *)&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
              __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pPVar11 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
            ParameterNotResolvedException::ParameterNotResolvedException(pPVar11);
            __cxa_throw(pPVar11,&ParameterNotResolvedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pLVar7 = ArrayType::GetChildType(pLVar7);
        }
        if (&local_80 != pLVar7) {
          local_80.id_ = pLVar7->id_;
          local_80.physical_type_ = pLVar7->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&local_80.type_info_,&pLVar7->type_info_);
        }
        bVar5 = LogicalType::TryGetMaxLogicalType(local_88,&local_68,&local_80,&local_68);
        if (!bVar5) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar12);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,
                     "Cannot concatenate lists of types %s[] and %s[] - an explicit cast is required"
                     ,"");
          LogicalType::ToString_abi_cxx11_(&local_a8,&local_68);
          LogicalType::ToString_abi_cxx11_(&local_50,&local_80);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar9,pEVar10,&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
          ;
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::~LogicalType(&local_80);
        bVar5 = false;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
    if (!bVar5) {
      LogicalType::LIST((LogicalType *)&local_e8,&local_68);
      pSVar3 = local_b0;
      bVar5 = local_c4._0_1_;
      SetArgumentType(local_b0,(LogicalType *)&local_e8,local_c4._0_1_);
      this_00._vptr_FunctionData = (_func_int **)operator_new(0x28);
      ConcatFunctionData::ConcatFunctionData
                ((ConcatFunctionData *)this_00._vptr_FunctionData,
                 &(pSVar3->super_BaseScalarFunction).return_type,bVar5);
      _Var13._M_head_impl = (FunctionData *)local_b8;
      *(_func_int ***)
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           this_00._vptr_FunctionData;
      LogicalType::~LogicalType((LogicalType *)&local_e8);
      goto LAB_0112392d;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_e8,SQLNULL);
  pSVar3 = local_b0;
  bVar5 = local_c4._0_1_;
  SetArgumentType(local_b0,(LogicalType *)&local_e8,local_c4._0_1_);
  LogicalType::~LogicalType((LogicalType *)&local_e8);
  pCVar8 = (ConcatFunctionData *)operator_new(0x28);
  ConcatFunctionData::ConcatFunctionData
            (pCVar8,&(pSVar3->super_BaseScalarFunction).return_type,bVar5);
  *(ConcatFunctionData **)
   local_b8._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = pCVar8;
  _Var13._M_head_impl =
       (FunctionData *)
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
LAB_0112392d:
  LogicalType::~LogicalType(&local_68);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var13._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> BindConcatFunctionInternal(ClientContext &context, ScalarFunction &bound_function,
                                                           vector<unique_ptr<Expression>> &arguments,
                                                           bool is_operator) {
	bool list_concat = false;
	// blob concat is only supported for the concat operator - regular concat converts to varchar
	bool all_blob = is_operator ? true : false;
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
		if (arg->return_type.id() == LogicalTypeId::LIST || arg->return_type.id() == LogicalTypeId::ARRAY) {
			list_concat = true;
		}
		if (arg->return_type.id() != LogicalTypeId::BLOB) {
			all_blob = false;
		}
	}
	if (list_concat) {
		return BindListConcat(context, bound_function, arguments, is_operator);
	}
	auto return_type = all_blob ? LogicalType::BLOB : LogicalType::VARCHAR;

	// we can now assume that the input is a string or castable to a string
	SetArgumentType(bound_function, return_type, is_operator);
	return make_uniq<ConcatFunctionData>(bound_function.return_type, is_operator);
}